

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RegexMatcher::split
          (RegexMatcher *this,UText *input,UText **dest,int32_t destCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int64_t iVar3;
  long lVar4;
  UText *ut;
  UChar *pUVar5;
  int64_t iVar6;
  UText *pUVar7;
  uint uVar8;
  uint uVar9;
  int destCapacity_00;
  long lVar10;
  uint uVar11;
  UErrorCode lengthStatus;
  UText remainingText;
  UErrorCode local_10c;
  UText **local_108;
  int32_t local_fc;
  ulong local_f8;
  int local_ec;
  UText *local_e8;
  ulong local_e0;
  int64_t local_d8;
  long local_d0;
  long local_c8;
  UText local_c0;
  
  iVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = 0;
    if (destCapacity < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      reset(this,input);
      if (this->fActiveLimit != 0) {
        uVar8 = destCapacity - 1;
        uVar11 = 0;
        if (destCapacity == 1) {
          iVar6 = 0;
        }
        else {
          local_fc = this->fPattern->fGroupMap->count;
          local_ec = destCapacity + -2;
          local_d0 = (long)local_ec;
          iVar6 = 0;
          local_e0 = (ulong)(uint)destCapacity;
          do {
            if (U_ZERO_ERROR < this->fDeferredStatus) {
LAB_00167197:
              if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit)
                  ) && (this->fInputLength == (long)input->nativeIndexingLimit)) {
                pUVar7 = dest[(int)uVar11];
                if (pUVar7 == (UText *)0x0) {
                  memset(&local_c0,0,0x90);
                  local_c0.magic = 0x345ad82c;
                  local_c0.sizeOfStruct = 0x90;
                  utext_openUChars_63(&local_c0,input->chunkContents + iVar6,
                                      this->fActiveLimit - iVar6,status);
                  pUVar7 = utext_clone_63((UText *)0x0,&local_c0,'\x01','\0',status);
                  dest[(int)uVar11] = pUVar7;
                  utext_close_63(&local_c0);
                }
                else {
                  iVar3 = utext_nativeLength_63(pUVar7);
                  utext_replace_63(pUVar7,0,iVar3,input->chunkContents + iVar6,
                                   (int)this->fActiveLimit - (int)iVar6,status);
                }
              }
              else {
                local_10c = U_ZERO_ERROR;
                iVar2 = utext_extract_63(input,iVar6,this->fActiveLimit,(UChar *)0x0,0,&local_10c);
                pUVar5 = (UChar *)uprv_malloc_63((long)iVar2 * 2 + 2);
                if (pUVar5 == (UChar *)0x0) {
                  *status = U_MEMORY_ALLOCATION_ERROR;
                }
                else {
                  utext_extract_63(input,iVar6,this->fActiveLimit,pUVar5,iVar2 + 1,status);
                  pUVar7 = dest[(int)uVar11];
                  if (pUVar7 == (UText *)0x0) {
                    memset(&local_c0,0,0x90);
                    local_c0.magic = 0x345ad82c;
                    local_c0.sizeOfStruct = 0x90;
                    utext_openUChars_63(&local_c0,pUVar5,(long)iVar2,status);
                    pUVar7 = utext_clone_63((UText *)0x0,&local_c0,'\x01','\0',status);
                    dest[(int)uVar11] = pUVar7;
                    utext_close_63(&local_c0);
                  }
                  else {
                    iVar6 = utext_nativeLength_63(pUVar7);
                    utext_replace_63(pUVar7,0,iVar6,pUVar5,iVar2,status);
                  }
                  uprv_free_63(pUVar5);
                }
              }
              goto LAB_00167482;
            }
            local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
            UVar1 = find(this,(UErrorCode *)&local_c0);
            if (UVar1 == '\0') goto LAB_00167197;
            if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit))
               && (this->fInputLength == (long)input->nativeIndexingLimit)) {
              pUVar7 = dest[(int)uVar11];
              if (pUVar7 == (UText *)0x0) {
                memset(&local_c0,0,0x90);
                local_c0.magic = 0x345ad82c;
                local_c0.sizeOfStruct = 0x90;
                utext_openUChars_63(&local_c0,input->chunkContents + iVar6,this->fMatchStart - iVar6
                                    ,status);
                pUVar7 = utext_clone_63((UText *)0x0,&local_c0,'\x01','\0',status);
                dest[(int)uVar11] = pUVar7;
                utext_close_63(&local_c0);
              }
              else {
                iVar3 = utext_nativeLength_63(pUVar7);
                utext_replace_63(pUVar7,0,iVar3,input->chunkContents + iVar6,
                                 (int)this->fMatchStart - (int)iVar6,status);
              }
            }
            else {
              local_10c = U_ZERO_ERROR;
              iVar2 = utext_extract_63(input,iVar6,this->fMatchStart,(UChar *)0x0,0,&local_10c);
              pUVar5 = (UChar *)uprv_malloc_63((long)iVar2 * 2 + 2);
              if (pUVar5 == (UChar *)0x0) {
                *status = U_MEMORY_ALLOCATION_ERROR;
              }
              else {
                utext_extract_63(input,iVar6,this->fMatchStart,pUVar5,iVar2 + 1,status);
                pUVar7 = dest[(int)uVar11];
                if (pUVar7 == (UText *)0x0) {
                  memset(&local_c0,0,0x90);
                  local_c0.magic = 0x345ad82c;
                  local_c0.sizeOfStruct = 0x90;
                  utext_openUChars_63(&local_c0,pUVar5,(long)iVar2,status);
                  pUVar7 = utext_clone_63((UText *)0x0,&local_c0,'\x01','\0',status);
                  dest[(int)uVar11] = pUVar7;
                  utext_close_63(&local_c0);
                }
                else {
                  iVar6 = utext_nativeLength_63(pUVar7);
                  utext_replace_63(pUVar7,0,iVar6,pUVar5,iVar2,status);
                }
                uprv_free_63(pUVar5);
              }
              if (pUVar5 == (UChar *)0x0) goto LAB_00167482;
            }
            local_d8 = this->fMatchEnd;
            if ((0 < local_fc) && ((int)uVar11 < local_ec)) {
              local_c8 = (long)(int)uVar11;
              local_108 = dest + local_c8;
              lVar10 = 1;
              do {
                pUVar7 = this->fInputText;
                ut = local_108[lVar10];
                iVar2 = (int32_t)lVar10;
                iVar6 = start64(this,iVar2,status);
                iVar3 = end64(this,iVar2,status);
                if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                  local_e8 = pUVar7;
                  if (iVar6 == iVar3) {
                    if (ut == (UText *)0x0) {
                      ut = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
                    }
                    else {
                      iVar6 = utext_nativeLength_63(ut);
                      utext_replace_63(ut,0,iVar6,(UChar *)0x0,0,status);
                    }
                  }
                  else {
                    uVar9 = utext_extract_63(pUVar7,iVar6,iVar3,(UChar *)0x0,0,status);
                    if (*status == U_BUFFER_OVERFLOW_ERROR || *status < U_ILLEGAL_ARGUMENT_ERROR) {
                      *status = U_ZERO_ERROR;
                      local_c0._0_8_ = (long)&local_c0 + 0xe;
                      local_c0.providerProperties = 0x28;
                      local_c0.sizeOfStruct = local_c0.sizeOfStruct & 0xffffff00;
                      if (0x27 < (int)uVar9) {
                        pUVar5 = (UChar *)uprv_malloc_63((ulong)(uVar9 * 2 + 2));
                        if (pUVar5 == (UChar *)0x0) {
                          *status = U_MEMORY_ALLOCATION_ERROR;
                        }
                        else {
                          if ((char)local_c0.sizeOfStruct != '\0') {
                            uprv_free_63((void *)local_c0._0_8_);
                          }
                          local_c0.providerProperties = uVar9 + 1;
                          local_c0.sizeOfStruct = CONCAT31(local_c0.sizeOfStruct._1_3_,1);
                          local_c0._0_8_ = pUVar5;
                        }
                      }
                      destCapacity_00 = uVar9 + 1;
                      local_f8 = (ulong)uVar9;
                      utext_extract_63(local_e8,iVar6,iVar3,(UChar *)local_c0._0_8_,destCapacity_00,
                                       status);
                      if (ut == (UText *)0x0) {
                        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                          pUVar5 = (UChar *)local_c0._0_8_;
                          if ((char)local_c0.sizeOfStruct == '\0') {
                            if ((int)local_f8 < 0) {
                              pUVar5 = (UChar *)0x0;
                            }
                            else {
                              if (local_c0.providerProperties < destCapacity_00) {
                                destCapacity_00 = local_c0.providerProperties;
                              }
                              pUVar5 = (UChar *)uprv_malloc_63((long)destCapacity_00 * 2);
                              if (pUVar5 != (UChar *)0x0) {
                                memcpy(pUVar5,(void *)local_c0._0_8_,(long)destCapacity_00 * 2);
                                goto LAB_00166f0a;
                              }
                              pUVar5 = (UChar *)0x0;
                            }
                          }
                          else {
LAB_00166f0a:
                            local_c0._0_8_ = (long)&local_c0 + 0xe;
                            local_c0.providerProperties = 0x28;
                            local_c0.sizeOfStruct = local_c0.sizeOfStruct & 0xffffff00;
                          }
                          if (pUVar5 == (UChar *)0x0) {
                            *status = U_MEMORY_ALLOCATION_ERROR;
                          }
                          else {
                            ut = utext_openUChars_63((UText *)0x0,pUVar5,(long)(int)local_f8,status)
                            ;
                            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                              *(byte *)&ut->providerProperties = (byte)ut->providerProperties | 0x20
                              ;
                              goto LAB_00166ee6;
                            }
                            uprv_free_63(pUVar5);
                          }
                        }
                        ut = (UText *)0x0;
                      }
                      else {
                        iVar6 = utext_nativeLength_63(ut);
                        utext_replace_63(ut,0,iVar6,(UChar *)local_c0._0_8_,(int32_t)local_f8,status
                                        );
                      }
LAB_00166ee6:
                      MaybeStackArray<char16_t,_40>::~MaybeStackArray
                                ((MaybeStackArray<char16_t,_40> *)&local_c0);
                    }
                  }
                }
                local_108[lVar10] = ut;
                uVar11 = uVar11 + 1;
              } while ((iVar2 < local_fc) &&
                      (lVar4 = local_c8 + lVar10, lVar10 = lVar10 + 1, lVar4 < local_d0));
            }
            iVar6 = local_d8;
            lVar10 = this->fActiveLimit;
            if (local_d8 == lVar10) {
              uVar9 = uVar11 + 1;
              if ((int)uVar9 < (int)local_e0) {
                pUVar7 = dest[(int)uVar9];
                uVar11 = uVar9;
                if (pUVar7 == (UText *)0x0) {
                  pUVar7 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
                  dest[(int)uVar9] = pUVar7;
                }
                else {
                  iVar3 = utext_nativeLength_63(pUVar7);
                  utext_replace_63(pUVar7,0,iVar3,L"",0,status);
                }
              }
            }
            if ((iVar6 == lVar10) || (U_ZERO_ERROR < *status)) goto LAB_00167482;
            uVar11 = uVar11 + 1;
          } while ((int)uVar11 < (int)uVar8);
        }
        lVar10 = this->fActiveLimit;
        uVar11 = uVar8;
        if (lVar10 - iVar6 != 0 && iVar6 <= lVar10) {
          if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit)) &&
             (this->fInputLength == (long)input->nativeIndexingLimit)) {
            pUVar7 = dest[uVar8];
            if (pUVar7 == (UText *)0x0) {
              memset(&local_c0,0,0x90);
              local_c0.magic = 0x345ad82c;
              local_c0.sizeOfStruct = 0x90;
              utext_openUChars_63(&local_c0,input->chunkContents + iVar6,lVar10 - iVar6,status);
              pUVar7 = utext_clone_63((UText *)0x0,&local_c0,'\x01','\0',status);
              dest[uVar8] = pUVar7;
              utext_close_63(&local_c0);
            }
            else {
              iVar3 = utext_nativeLength_63(pUVar7);
              utext_replace_63(pUVar7,0,iVar3,input->chunkContents + iVar6,
                               (int)this->fActiveLimit - (int)iVar6,status);
            }
          }
          else {
            local_10c = U_ZERO_ERROR;
            iVar2 = utext_extract_63(input,iVar6,lVar10,(UChar *)0x0,0,&local_10c);
            pUVar5 = (UChar *)uprv_malloc_63((long)iVar2 * 2 + 2);
            if (pUVar5 == (UChar *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              utext_extract_63(input,iVar6,this->fActiveLimit,pUVar5,iVar2 + 1,status);
              pUVar7 = dest[uVar8];
              if (pUVar7 == (UText *)0x0) {
                memset(&local_c0,0,0x90);
                local_c0.magic = 0x345ad82c;
                local_c0.sizeOfStruct = 0x90;
                utext_openUChars_63(&local_c0,pUVar5,(long)iVar2,status);
                pUVar7 = utext_clone_63((UText *)0x0,&local_c0,'\x01','\0',status);
                dest[uVar8] = pUVar7;
                utext_close_63(&local_c0);
              }
              else {
                iVar6 = utext_nativeLength_63(pUVar7);
                utext_replace_63(pUVar7,0,iVar6,pUVar5,iVar2,status);
              }
              uprv_free_63(pUVar5);
            }
          }
        }
LAB_00167482:
        iVar2 = uVar11 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t  RegexMatcher::split(UText *input,
        UText           *dest[],
        int32_t          destCapacity,
        UErrorCode      &status)
{
    //
    // Check arguements for validity
    //
    if (U_FAILURE(status)) {
        return 0;
    };

    if (destCapacity < 1) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //
    // Reset for the input text
    //
    reset(input);
    int64_t   nextOutputStringStart = 0;
    if (fActiveLimit == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t i;
    int32_t numCaptureGroups = fPattern->fGroupMap->size();
    for (i=0; ; i++) {
        if (i>=destCapacity-1) {
            // There is one or zero output string left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            i = destCapacity-1;
            if (fActiveLimit > nextOutputStringStart) {
                if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                      input->chunkContents+nextOutputStringStart,
                                      (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                         fActiveLimit-nextOutputStringStart, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }
                } else {
                    UErrorCode lengthStatus = U_ZERO_ERROR;
                    int32_t remaining16Length =
                        utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                    UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                    if (remainingChars == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                        break;
                    }

                    utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }

                    uprv_free(remainingChars);
                }
            }
            break;
        }
        if (find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fMatchStart-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                      fMatchStart-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fMatchStart, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                utext_extract(input, nextOutputStringStart, fMatchStart, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            nextOutputStringStart = fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                if (i >= destCapacity-2) {
                    // Never fill the last available output string with capture group text.
                    // It will filled with the last field, the remainder of the
                    //  unsplit input text.
                    break;
                }
                i++;
                dest[i] = utext_extract_replace(fInputText, dest[i],
                                               start64(groupNum, status), end64(groupNum, status), &status);
            }

            if (nextOutputStringStart == fActiveLimit) {
                // The delimiter was at the end of the string.  We're done, but first
                // we output one last empty string, for the empty field following
                //   the delimiter at the end of input.
                if (i+1 < destCapacity) {
                    ++i;
                    if (dest[i] == NULL) {
                        dest[i] = utext_openUChars(NULL, NULL, 0, &status);
                    } else {
                        static const UChar emptyString[] = {(UChar)0};
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), emptyString, 0, &status);
                    }
                }
                break;

            }
        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                     fActiveLimit-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }

                utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            break;
        }
        if (U_FAILURE(status)) {
            break;
        }
    }   // end of for loop
    return i+1;
}